

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_WrongTypeTreatedAsUnknownViaReflection_Test::
TestBody(UnknownFieldSetTest_WrongTypeTreatedAsUnknownViaReflection_Test *this)

{
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  string_view data;
  string bizarro_data;
  TestEmptyMessage empty_message;
  CodedInputStream input;
  ArrayInputStream raw_input;
  TestAllTypes all_types_message;
  AssertHelper AStack_458;
  Message local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  undefined1 local_440 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  string local_420;
  string local_400;
  ZeroFieldsBase local_3e0;
  CodedInputStream local_3c8;
  ArrayInputStream local_370;
  TestAllTypes local_350;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_350,(Arena *)0x0);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage((TestEmptyMessage *)&local_3e0,(Arena *)0x0);
  UnknownFieldSetTest::GetBizarroData_abi_cxx11_(&local_400,&this->super_UnknownFieldSetTest);
  io::ArrayInputStream::ArrayInputStream
            (&local_370,local_400._M_dataplus._M_p,(int)local_400._M_string_length,-1);
  local_3c8.buffer_ = (uint8_t *)0x0;
  local_3c8.buffer_end_ = (uint8_t *)0x0;
  local_3c8._24_7_ = 0;
  local_3c8.overflow_bytes_._3_1_ = 0;
  local_3c8.last_tag_ = 0;
  local_3c8.legitimate_message_end_ = false;
  local_3c8.aliasing_enabled_ = false;
  local_3c8.force_eager_parsing_ = false;
  local_3c8.current_limit_ = 0x7fffffff;
  local_3c8.buffer_size_after_limit_ = 0;
  local_3c8.total_bytes_limit_ = 0x7fffffff;
  local_3c8.recursion_budget_ = io::CodedInputStream::default_recursion_limit_;
  local_3c8.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_3c8.extension_pool_ = (DescriptorPool *)0x0;
  local_3c8.extension_factory_ = (MessageFactory *)0x0;
  local_3c8.input_ = &local_370.super_ZeroCopyInputStream;
  io::CodedInputStream::Refresh(&local_3c8);
  local_440[0] = (internal)
                 protobuf::internal::WireFormat::ParseAndMergePartial
                           (&local_3c8,&local_350.super_Message);
  local_438 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_440[0]) {
    data._M_len._4_4_ = local_400._M_string_length._4_4_;
    data._M_len._0_4_ = (int)local_400._M_string_length;
    data._M_str = local_400._M_dataplus._M_p;
    local_440[0] = (internal)MessageLite::ParseFromString((MessageLite *)&local_3e0,data);
    local_438 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_440[0]) {
      testing::Message::Message(&local_450);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_420,(internal *)local_440,
                 (AssertionResult *)"empty_message.ParseFromString(bizarro_data)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_458,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
                 ,0x1f6,local_420._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_458,&local_450);
      goto LAB_0099ae71;
    }
    Message::DebugString_abi_cxx11_(&local_420,&local_3e0.super_Message);
    Message::DebugString_abi_cxx11_((string *)local_440,&local_350.super_Message);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_450,"empty_message.DebugString()",
               "all_types_message.DebugString()",&local_420,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_440._1_7_,local_440[0]) != &local_430) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_440._1_7_,local_440[0]),local_430._M_allocated_capacity + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if (local_450.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_420);
      if (local_448 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a22956 + 5;
      }
      else {
        message = (local_448->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_440,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
                 ,0x1f8,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_440,(Message *)&local_420);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_440);
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_420._M_dataplus._M_p + 8))();
      }
    }
    if (local_448 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0099af12;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_448;
  }
  else {
    testing::Message::Message(&local_450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_420,(internal *)local_440,
               (AssertionResult *)"WireFormat::ParseAndMergePartial(&input, &all_types_message)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_458,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x1f5,local_420._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_458,&local_450);
LAB_0099ae71:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_438;
    testing::internal::AssertHelper::~AssertHelper(&AStack_458);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_450.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_450.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_450.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_450.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    local_448 = local_438;
    if (local_438 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0099af12;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_448);
LAB_0099af12:
  io::CodedInputStream::~CodedInputStream(&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  protobuf::internal::ZeroFieldsBase::~ZeroFieldsBase(&local_3e0);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_350);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, WrongTypeTreatedAsUnknownViaReflection) {
  // Same as WrongTypeTreatedAsUnknown but via the reflection interface.

  unittest::TestAllTypes all_types_message;
  unittest::TestEmptyMessage empty_message;
  std::string bizarro_data = GetBizarroData();
  io::ArrayInputStream raw_input(bizarro_data.data(), bizarro_data.size());
  io::CodedInputStream input(&raw_input);
  ASSERT_TRUE(WireFormat::ParseAndMergePartial(&input, &all_types_message));
  ASSERT_TRUE(empty_message.ParseFromString(bizarro_data));

  EXPECT_EQ(empty_message.DebugString(), all_types_message.DebugString());
}